

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_traceexec(lua_State *L)

{
  Instruction **ppIVar1;
  int *piVar2;
  uint uVar3;
  CallInfo *pCVar4;
  Instruction *pIVar5;
  long lVar6;
  long lVar7;
  int line;
  byte bVar8;
  int iVar9;
  
  pCVar4 = L->ci;
  uVar3 = L->hookmask;
  piVar2 = &L->hookcount;
  *piVar2 = *piVar2 + -1;
  bVar8 = (byte)((uVar3 & 8) >> 3) & *piVar2 == 0;
  if (bVar8 == 1) {
    L->hookcount = L->basehookcount;
  }
  else if ((uVar3 & 4) == 0) {
    return;
  }
  if ((pCVar4->callstatus & 0x40) != 0) {
    pCVar4->callstatus = pCVar4->callstatus & 0xffbf;
    return;
  }
  if (bVar8 != 0) {
    luaD_hook(L,3,-1);
  }
  if ((uVar3 & 4) != 0) {
    pIVar5 = (pCVar4->u).l.savedpc;
    lVar6 = *(long *)((pCVar4->func->value_).f + 0x18);
    lVar7 = *(long *)(lVar6 + 0x38);
    lVar6 = *(long *)(lVar6 + 0x48);
    iVar9 = (int)((ulong)((long)pIVar5 - lVar7) >> 2) + -1;
    if (lVar6 == 0) {
      line = -1;
    }
    else {
      line = *(int *)(lVar6 + (long)iVar9 * 4);
    }
    if ((iVar9 != 0) && (L->oldpc < pIVar5)) {
      if (lVar6 == 0) {
        iVar9 = -1;
      }
      else {
        iVar9 = *(int *)(lVar6 + (((long)L->oldpc - lVar7) * 0x40000000 + -0x100000000 >> 0x20) * 4)
        ;
      }
      if (line == iVar9) goto LAB_0010b3e8;
    }
    luaD_hook(L,2,line);
  }
LAB_0010b3e8:
  L->oldpc = (pCVar4->u).l.savedpc;
  if (L->status != '\x01') {
    return;
  }
  if (bVar8 != 0) {
    L->hookcount = 1;
  }
  ppIVar1 = &(pCVar4->u).l.savedpc;
  *ppIVar1 = *ppIVar1 + -1;
  *(byte *)&pCVar4->callstatus = (byte)pCVar4->callstatus | 0x40;
  pCVar4->func = L->top + -1;
  luaD_throw(L,1);
}

Assistant:

void luaG_traceexec(lua_State *L) {
    CallInfo *ci = L->ci;
    lu_byte mask = L->hookmask;
    int counthook = (--L->hookcount == 0 && (mask & LUA_MASKCOUNT));
    if (counthook)
        resethookcount(L);  /* reset count */
    else if (!(mask & LUA_MASKLINE))
        return;  /* no line hook and count != 0; nothing to be done */
    if (ci->callstatus & CIST_HOOKYIELD) {  /* called hook last time? */
        ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
        return;  /* do not call hook again (VM yielded, so it did not move) */
    }
    if (counthook)
        luaD_hook(L, LUA_HOOKCOUNT, -1);  /* call count hook */
    if (mask & LUA_MASKLINE) {
        Proto *p = ci_func(ci)->p;
        int npc = pcRel(ci->u.l.savedpc, p);
        int newline = getfuncline(p, npc);
        if (npc == 0 ||  /* call linehook when enter a new function, */
            ci->u.l.savedpc <= L->oldpc ||  /* when jump back (loop), or when */
            newline != getfuncline(p, pcRel(L->oldpc, p)))  /* enter a new line */
            luaD_hook(L, LUA_HOOKLINE, newline);  /* call line hook */
    }
    L->oldpc = ci->u.l.savedpc;
    if (L->status == LUA_YIELD) {  /* did hook yield? */
        if (counthook)
            L->hookcount = 1;  /* undo decrement to zero */
        ci->u.l.savedpc--;  /* undo increment (resume will increment it again) */
        ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
        ci->func = L->top - 1;  /* protect stack below results */
        luaD_throw(L, LUA_YIELD);
    }
}